

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O0

void __thiscall InfiniteTape::InfiniteTape(InfiniteTape *this,int64_t opt)

{
  iterator iVar1;
  value_type local_20;
  int64_t local_18;
  int64_t opt_local;
  InfiniteTape *this_local;
  
  local_18 = opt;
  opt_local = (int64_t)this;
  BasicTape::BasicTape(&this->super_BasicTape,opt);
  (this->super_BasicTape)._vptr_BasicTape = (_func_int **)&PTR__InfiniteTape_001689b8;
  std::__cxx11::
  list<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ::list(&this->tape);
  std::_List_iterator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>::_List_iterator(&this->it)
  ;
  CellGenerator::operator()((CellGenerator *)&local_20);
  std::__cxx11::
  list<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ::push_back(&this->tape,&local_20);
  std::unique_ptr<Cell,_std::default_delete<Cell>_>::~unique_ptr(&local_20);
  iVar1 = std::__cxx11::
          list<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
          ::begin(&this->tape);
  (this->it)._M_node = iVar1._M_node;
  return;
}

Assistant:

InfiniteTape::InfiniteTape(int64_t opt) : BasicTape { opt } {
    tape.push_back(generator());
    it = tape.begin();
}